

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::updateMPF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  pointer piVar1;
  HFactor *pHVar2;
  HFactor *pHVar3;
  HVector *pHVar4;
  HVector *pHVar5;
  int iVar6;
  long lVar7;
  int i;
  long lVar8;
  long lVar9;
  int local_64;
  HFactor *local_60;
  double local_58;
  ulong local_50;
  int *local_48;
  HVector *local_40;
  HVector *local_38;
  
  this_00 = &this->PFindex;
  local_50 = (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  this_01 = &this->PFvalue;
  lVar7 = 0;
  lVar9 = 0;
  local_64 = iRow;
  local_60 = this;
  local_48 = hint;
  local_40 = ep;
  for (lVar8 = 0; pHVar2 = local_60, lVar8 < aq->packCount; lVar8 = lVar8 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (this_00,(value_type *)
                       ((long)(aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar9));
    std::vector<double,_std::allocator<double>_>::push_back
              (this_01,(value_type_conflict1 *)
                       ((long)(aq->packValue).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar7));
    lVar9 = lVar9 + 4;
    lVar7 = lVar7 + 8;
  }
  local_50 = local_50 >> 2;
  piVar1 = (local_60->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(local_60->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iRow];
  lVar9 = (long)piVar1[lVar8];
  iVar6 = piVar1[lVar8 + 1];
  lVar7 = lVar9 * 4;
  local_38 = aq;
  for (; lVar9 < iVar6; lVar9 = lVar9 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (this_00,(value_type *)
                       ((long)(pHVar2->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + lVar7));
    local_58 = -*(double *)
                 ((long)(pHVar2->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start + lVar7 * 2);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&local_58);
    lVar7 = lVar7 + 4;
  }
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_64);
  pHVar2 = local_60;
  local_58 = -(local_60->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&local_58);
  local_58 = (double)CONCAT44(local_58._4_4_,
                              (int)((ulong)((long)(pHVar2->PFindex).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pHVar2->PFindex).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&pHVar2->PFstart,(int *)&local_58);
  pHVar4 = local_40;
  lVar7 = 0;
  lVar9 = 0;
  for (lVar8 = 0; pHVar3 = local_60, lVar8 < pHVar4->packCount; lVar8 = lVar8 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (this_00,(value_type *)
                       ((long)(pHVar4->packIndex).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar9));
    std::vector<double,_std::allocator<double>_>::push_back
              (this_01,(value_type_conflict1 *)
                       ((long)(pHVar4->packValue).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7));
    lVar9 = lVar9 + 4;
    lVar7 = lVar7 + 8;
  }
  local_58 = (double)CONCAT44(local_58._4_4_,
                              (int)((ulong)((long)(local_60->PFindex).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_60->PFindex).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&pHVar2->PFstart,(int *)&local_58);
  pHVar5 = local_38;
  std::vector<double,_std::allocator<double>_>::push_back
            (&pHVar3->PFpivotValue,
             (local_38->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + local_64);
  iVar6 = pHVar4->packCount + pHVar5->packCount + pHVar3->UtotalX;
  pHVar3->UtotalX = iVar6;
  pHVar3->FtotalX =
       pHVar3->FtotalX +
       ((int)((ulong)((long)(pHVar3->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pHVar3->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) - (int)local_50);
  if (pHVar3->UmeritX < iVar6) {
    *local_48 = 1;
  }
  return;
}

Assistant:

void HFactor::updateMPF(HVector *aq, HVector *ep, int iRow, int *hint) {
    int PFcountX0 = PFindex.size();

    // Store elements
    for (int i = 0; i < aq->packCount; i++) {
        PFindex.push_back(aq->packIndex[i]);
        PFvalue.push_back(aq->packValue[i]);
    }
    int pLogic = UpivotLookup[iRow];
    int UstartX = Ustart[pLogic];
    int UendX = Ustart[pLogic + 1];
    for (int k = UstartX; k < UendX; k++) {
        PFindex.push_back(Uindex[k]);
        PFvalue.push_back(-Uvalue[k]);
    }
    PFindex.push_back(iRow);
    PFvalue.push_back(-UpivotValue[pLogic]);
    PFstart.push_back(PFindex.size());

    for (int i = 0; i < ep->packCount; i++) {
        PFindex.push_back(ep->packIndex[i]);
        PFvalue.push_back(ep->packValue[i]);
    }
    PFstart.push_back(PFindex.size());

    // Store pivot
    PFpivotValue.push_back(aq->array[iRow]);

    // Refactor or not
    UtotalX += aq->packCount + ep->packCount;
    FtotalX += PFindex.size() - PFcountX0;
    if (UtotalX > UmeritX)
        *hint = 1;
}